

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

float refineBySAT(Abc_Ntk_t *pNtk1,Vec_Int_t **iMatch1,int *iGroup1,Vec_Int_t **iDep1,
                 int *iLastItem1,Vec_Int_t **oMatch1,int *oGroup1,Vec_Int_t **oDep1,int *oLastItem1,
                 int *observability1,Abc_Ntk_t *pNtk2,Vec_Int_t **iMatch2,int *iGroup2,
                 Vec_Int_t **iDep2,int *iLastItem2,Vec_Int_t **oMatch2,int *oGroup2,
                 Vec_Int_t **oDep2,int *oLastItem2,int *observability2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  Vec_Int_t *p;
  Vec_Int_t *matchedInputs1_00;
  Vec_Int_t *matchedInputs2_00;
  Vec_Int_t *matchedOutputs1_00;
  Vec_Int_t *matchedOutputs2_00;
  Vec_Ptr_t **nodesInLevel1_00;
  Vec_Ptr_t *pVVar6;
  Abc_Obj_t *pAVar7;
  Vec_Ptr_t **nodesInLevel2_00;
  Vec_Int_t *oMatchedGroups_00;
  Vec_Int_t *oNonSingleton_00;
  Abc_Ntk_t *subNtk1_00;
  Abc_Ntk_t *subNtk2_00;
  abctime aVar8;
  FILE *__stream;
  char *pcVar9;
  char *pcVar10;
  Abc_Ntk_t *subNtk2;
  Abc_Ntk_t *subNtk1;
  Vec_Ptr_t *oMatchPairs;
  Vec_Int_t *oNonSingleton;
  int temp_1;
  int temp;
  float satTime;
  abctime clk;
  int matchFound;
  FILE *result;
  Vec_Int_t *oMatchedGroups;
  Vec_Ptr_t **nodesInLevel2;
  Vec_Ptr_t **nodesInLevel1;
  Vec_Int_t *matchedOutputs2;
  Vec_Int_t *matchedOutputs1;
  Vec_Int_t *matchedInputs2;
  Vec_Int_t *matchedInputs1;
  Vec_Int_t *iNonSingleton;
  Abc_Obj_t *pObj;
  int j;
  int i;
  Vec_Int_t **oMatch1_local;
  int *iLastItem1_local;
  Vec_Int_t **iDep1_local;
  int *iGroup1_local;
  Vec_Int_t **iMatch1_local;
  Abc_Ntk_t *pNtk1_local;
  
  aVar5 = Abc_Clock();
  p = Vec_IntAlloc(10);
  iVar1 = Abc_NtkPiNum(pNtk1);
  matchedInputs1_00 = Vec_IntAlloc(iVar1);
  iVar1 = Abc_NtkPiNum(pNtk2);
  matchedInputs2_00 = Vec_IntAlloc(iVar1);
  iVar1 = Abc_NtkPoNum(pNtk1);
  matchedOutputs1_00 = Vec_IntAlloc(iVar1);
  iVar1 = Abc_NtkPoNum(pNtk2);
  matchedOutputs2_00 = Vec_IntAlloc(iVar1);
  iVar1 = Abc_AigLevel(pNtk1);
  nodesInLevel1_00 = (Vec_Ptr_t **)malloc((long)(iVar1 + 1) << 3);
  for (pObj._4_4_ = 0; iVar1 = Abc_AigLevel(pNtk1), pObj._4_4_ <= iVar1; pObj._4_4_ = pObj._4_4_ + 1
      ) {
    pVVar6 = Vec_PtrAlloc(0x14);
    nodesInLevel1_00[pObj._4_4_] = pVVar6;
  }
  for (pObj._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk1->vObjs), pObj._4_4_ < iVar1;
      pObj._4_4_ = pObj._4_4_ + 1) {
    pAVar7 = Abc_NtkObj(pNtk1,pObj._4_4_);
    if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar7), iVar1 != 0)) {
      iVar1 = Abc_ObjLevel(pAVar7);
      Vec_PtrPush(nodesInLevel1_00[iVar1],pAVar7);
    }
  }
  iVar1 = Abc_AigLevel(pNtk2);
  nodesInLevel2_00 = (Vec_Ptr_t **)malloc((long)(iVar1 + 1) << 3);
  for (pObj._4_4_ = 0; iVar1 = Abc_AigLevel(pNtk2), pObj._4_4_ <= iVar1; pObj._4_4_ = pObj._4_4_ + 1
      ) {
    pVVar6 = Vec_PtrAlloc(0x14);
    nodesInLevel2_00[pObj._4_4_] = pVVar6;
  }
  for (pObj._4_4_ = 0; iVar1 = Vec_PtrSize(pNtk2->vObjs), pObj._4_4_ < iVar1;
      pObj._4_4_ = pObj._4_4_ + 1) {
    pAVar7 = Abc_NtkObj(pNtk2,pObj._4_4_);
    if ((pAVar7 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_AigNodeIsAnd(pAVar7), iVar1 != 0)) {
      iVar1 = Abc_ObjLevel(pAVar7);
      Vec_PtrPush(nodesInLevel2_00[iVar1],pAVar7);
    }
  }
  oMatchedGroups_00 = Vec_IntAlloc(10);
  for (pObj._4_4_ = 0; pObj._4_4_ < *iLastItem1; pObj._4_4_ = pObj._4_4_ + 1) {
    iVar1 = Vec_IntSize(iMatch1[pObj._4_4_]);
    if (iVar1 == 1) {
      iVar1 = Vec_IntEntryLast(iMatch1[pObj._4_4_]);
      Vec_IntPush(matchedInputs1_00,iVar1);
      iVar1 = Vec_IntEntryLast(iMatch2[pObj._4_4_]);
      Vec_IntPush(matchedInputs2_00,iVar1);
    }
    else {
      Vec_IntPush(p,pObj._4_4_);
    }
  }
  for (pObj._4_4_ = 0; pObj._4_4_ < *oLastItem1; pObj._4_4_ = pObj._4_4_ + 1) {
    iVar1 = Vec_IntSize(oMatch1[pObj._4_4_]);
    if (iVar1 == 1) {
      iVar1 = Vec_IntEntryLast(oMatch1[pObj._4_4_]);
      Vec_IntPush(matchedOutputs1_00,iVar1);
      iVar1 = Vec_IntEntryLast(oMatch2[pObj._4_4_]);
      Vec_IntPush(matchedOutputs2_00,iVar1);
    }
  }
  for (pObj._4_4_ = 0; iVar1 = Vec_IntSize(p), pObj._0_4_ = pObj._4_4_, pObj._4_4_ < iVar1 + -1;
      pObj._4_4_ = pObj._4_4_ + 1) {
    while( true ) {
      pObj._0_4_ = (int)pObj + 1;
      iVar1 = Vec_IntSize(p);
      if (iVar1 <= (int)pObj) break;
      iVar1 = Vec_IntEntry(p,(int)pObj);
      iVar1 = Vec_IntEntry(iMatch2[iVar1],0);
      iVar1 = observability2[iVar1];
      iVar2 = Vec_IntEntry(p,pObj._4_4_);
      iVar2 = Vec_IntEntry(iMatch2[iVar2],0);
      if (observability2[iVar2] < iVar1) {
        iVar1 = Vec_IntEntry(p,pObj._4_4_);
        iVar2 = Vec_IntEntry(p,(int)pObj);
        Vec_IntWriteEntry(p,pObj._4_4_,iVar2);
        Vec_IntWriteEntry(p,(int)pObj,iVar1);
      }
      else {
        iVar1 = Vec_IntEntry(p,(int)pObj);
        iVar1 = Vec_IntEntry(iMatch2[iVar1],0);
        iVar1 = observability2[iVar1];
        iVar2 = Vec_IntEntry(p,pObj._4_4_);
        iVar2 = Vec_IntEntry(iMatch2[iVar2],0);
        if (iVar1 == observability2[iVar2]) {
          iVar1 = Vec_IntEntry(p,(int)pObj);
          iVar1 = Vec_IntSize(iMatch2[iVar1]);
          iVar2 = Vec_IntEntry(p,pObj._4_4_);
          iVar2 = Vec_IntSize(iMatch2[iVar2]);
          if (iVar1 < iVar2) {
            iVar1 = Vec_IntEntry(p,pObj._4_4_);
            iVar2 = Vec_IntEntry(p,(int)pObj);
            Vec_IntWriteEntry(p,pObj._4_4_,iVar2);
            Vec_IntWriteEntry(p,(int)pObj,iVar1);
          }
        }
      }
    }
  }
  clk._4_4_ = match1by1(pNtk1,nodesInLevel1_00,iMatch1,iDep1,matchedInputs1_00,iGroup1,oMatch1,
                        oGroup1,pNtk2,nodesInLevel2_00,iMatch2,iDep2,matchedInputs2_00,iGroup2,
                        oMatch2,oGroup2,matchedOutputs1_00,matchedOutputs2_00,oMatchedGroups_00,p,0,
                        0);
  if (clk._4_4_ != 0) {
    iVar1 = Vec_IntSize(matchedOutputs1_00);
    iVar2 = Abc_NtkPoNum(pNtk1);
    if (iVar1 != iVar2) {
      oNonSingleton_00 = Vec_IntAlloc(10);
      iVar1 = Abc_NtkPoNum(pNtk1);
      pVVar6 = Vec_PtrAlloc(iVar1 << 1);
      for (pObj._4_4_ = 0; pObj._4_4_ < *oLastItem1; pObj._4_4_ = pObj._4_4_ + 1) {
        iVar1 = Vec_IntSize(oMatch1[pObj._4_4_]);
        if ((1 < iVar1) && (iVar1 = Vec_IntFind(oMatchedGroups_00,pObj._4_4_), iVar1 == -1)) {
          Vec_IntPush(oNonSingleton_00,pObj._4_4_);
        }
      }
      subNtk1_00 = computeCofactor(pNtk1,nodesInLevel1_00,(int *)0x0,matchedInputs1_00);
      subNtk2_00 = computeCofactor(pNtk2,nodesInLevel2_00,(int *)0x0,matchedInputs2_00);
      clk._4_4_ = matchNonSingletonOutputs
                            (pNtk1,nodesInLevel1_00,iMatch1,iDep1,matchedInputs1_00,iGroup1,oMatch1,
                             oGroup1,pNtk2,nodesInLevel2_00,iMatch2,iDep2,matchedInputs2_00,iGroup1,
                             oMatch2,oGroup2,matchedOutputs1_00,matchedOutputs2_00,oMatchedGroups_00
                             ,(Vec_Int_t *)0x0,subNtk1_00,subNtk2_00,pVVar6,oNonSingleton_00,0,0,0,0
                            );
      Vec_IntFree(oNonSingleton_00);
      Vec_PtrFree(pVVar6);
      Abc_NtkDelete(subNtk1_00);
      Abc_NtkDelete(subNtk2_00);
    }
  }
  aVar8 = Abc_Clock();
  if (clk._4_4_ != 0) {
    checkEquivalence(pNtk1,matchedInputs1_00,matchedOutputs1_00,pNtk2,matchedInputs2_00,
                     matchedOutputs2_00);
    __stream = fopen("IOmatch.txt","w");
    uVar3 = Abc_NtkPiNum(pNtk1);
    uVar4 = Abc_NtkPoNum(pNtk1);
    fprintf(__stream,"I/O = %d / %d \n\n",(ulong)uVar3,(ulong)uVar4);
    for (pObj._4_4_ = 0; iVar1 = Vec_IntSize(matchedInputs1_00), pObj._4_4_ < iVar1;
        pObj._4_4_ = pObj._4_4_ + 1) {
      iVar1 = Vec_IntEntry(matchedInputs1_00,pObj._4_4_);
      pAVar7 = Abc_NtkPi(pNtk1,iVar1);
      pcVar9 = Abc_ObjName(pAVar7);
      iVar1 = Vec_IntEntry(matchedInputs2_00,pObj._4_4_);
      pAVar7 = Abc_NtkPi(pNtk2,iVar1);
      pcVar10 = Abc_ObjName(pAVar7);
      fprintf(__stream,"{%s}\t{%s}\n",pcVar9,pcVar10);
    }
    fprintf(__stream,"\n-----------------------------------------\n");
    for (pObj._4_4_ = 0; iVar1 = Vec_IntSize(matchedOutputs1_00), pObj._4_4_ < iVar1;
        pObj._4_4_ = pObj._4_4_ + 1) {
      iVar1 = Vec_IntEntry(matchedOutputs1_00,pObj._4_4_);
      pAVar7 = Abc_NtkPo(pNtk1,iVar1);
      pcVar9 = Abc_ObjName(pAVar7);
      iVar1 = Vec_IntEntry(matchedOutputs2_00,pObj._4_4_);
      pAVar7 = Abc_NtkPo(pNtk2,iVar1);
      pcVar10 = Abc_ObjName(pAVar7);
      fprintf(__stream,"{%s}\t{%s}\n",pcVar9,pcVar10);
    }
    fclose(__stream);
  }
  Vec_IntFree(matchedInputs1_00);
  Vec_IntFree(matchedInputs2_00);
  Vec_IntFree(matchedOutputs1_00);
  Vec_IntFree(matchedOutputs2_00);
  Vec_IntFree(p);
  Vec_IntFree(oMatchedGroups_00);
  for (pObj._4_4_ = 0; iVar1 = Abc_AigLevel(pNtk1), pObj._4_4_ <= iVar1; pObj._4_4_ = pObj._4_4_ + 1
      ) {
    Vec_PtrFree(nodesInLevel1_00[pObj._4_4_]);
  }
  for (pObj._4_4_ = 0; iVar1 = Abc_AigLevel(pNtk2), pObj._4_4_ <= iVar1; pObj._4_4_ = pObj._4_4_ + 1
      ) {
    Vec_PtrFree(nodesInLevel2_00[pObj._4_4_]);
  }
  if (nodesInLevel1_00 != (Vec_Ptr_t **)0x0) {
    free(nodesInLevel1_00);
  }
  if (nodesInLevel2_00 != (Vec_Ptr_t **)0x0) {
    free(nodesInLevel2_00);
  }
  return (float)(aVar8 - aVar5) / 1e+06;
}

Assistant:

float refineBySAT(Abc_Ntk_t * pNtk1, Vec_Int_t ** iMatch1, int * iGroup1, Vec_Int_t ** iDep1, int* iLastItem1, Vec_Int_t ** oMatch1, int * oGroup1, Vec_Int_t ** oDep1, int* oLastItem1, int * observability1,
                 Abc_Ntk_t * pNtk2, Vec_Int_t ** iMatch2, int * iGroup2, Vec_Int_t ** iDep2, int* iLastItem2, Vec_Int_t ** oMatch2, int * oGroup2, Vec_Int_t ** oDep2, int* oLastItem2, int * observability2)
{
    int i, j;    
    Abc_Obj_t * pObj;
    Vec_Int_t * iNonSingleton;
    Vec_Int_t * matchedInputs1, * matchedInputs2;
    Vec_Int_t * matchedOutputs1, * matchedOutputs2;
    Vec_Ptr_t ** nodesInLevel1, ** nodesInLevel2;
    Vec_Int_t * oMatchedGroups;
    FILE *result;    
    int matchFound;
    abctime clk = Abc_Clock();
    float satTime = 0.0;

    /*matchFile = fopen("satmatch.txt", "w");*/
    
    iNonSingleton = Vec_IntAlloc(10);    
    
    matchedInputs1 = Vec_IntAlloc( Abc_NtkPiNum(pNtk1) );
    matchedInputs2 = Vec_IntAlloc( Abc_NtkPiNum(pNtk2) );

    matchedOutputs1 = Vec_IntAlloc( Abc_NtkPoNum(pNtk1) );
    matchedOutputs2 = Vec_IntAlloc( Abc_NtkPoNum(pNtk2) );

    nodesInLevel1 = ABC_ALLOC( Vec_Ptr_t *, Abc_AigLevel( pNtk1 ) + 1);    // why numOfLevels+1? because the inputs are in level 0
    for(i = 0; i <= Abc_AigLevel( pNtk1 ); i++)
        nodesInLevel1[i] = Vec_PtrAlloc( 20 );

    // bucket sort the objects based on their levels
    Abc_AigForEachAnd( pNtk1, pObj, i )    
        Vec_PtrPush(nodesInLevel1[Abc_ObjLevel(pObj)], pObj);
    
    nodesInLevel2 = ABC_ALLOC( Vec_Ptr_t *, Abc_AigLevel( pNtk2 ) + 1);    // why numOfLevels+1? because the inputs are in level 0
    for(i = 0; i <= Abc_AigLevel( pNtk2 ); i++)
        nodesInLevel2[i] = Vec_PtrAlloc( 20 );

    // bucket sort the objects based on their levels
    Abc_AigForEachAnd( pNtk2, pObj, i )    
        Vec_PtrPush(nodesInLevel2[Abc_ObjLevel(pObj)], pObj);    

    oMatchedGroups = Vec_IntAlloc( 10 );

    for(i = 0; i < *iLastItem1; i++)
    {
        if(Vec_IntSize(iMatch1[i]) == 1)
        {
            Vec_IntPush(matchedInputs1, Vec_IntEntryLast(iMatch1[i]));
            Vec_IntPush(matchedInputs2, Vec_IntEntryLast(iMatch2[i]));        
        }
        else
            Vec_IntPush(iNonSingleton, i);
    }

    for(i = 0; i < *oLastItem1; i++)
    {
        if(Vec_IntSize(oMatch1[i]) == 1)
        {
            Vec_IntPush(matchedOutputs1, Vec_IntEntryLast(oMatch1[i]));
            Vec_IntPush(matchedOutputs2, Vec_IntEntryLast(oMatch2[i]));
        }
    }
    
    for(i = 0; i < Vec_IntSize(iNonSingleton) - 1; i++)
    {
        for(j = i + 1; j < Vec_IntSize(iNonSingleton); j++)        
            if( observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, j)], 0)] > 
                observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, i)], 0)] )
            {                
                int temp = Vec_IntEntry(iNonSingleton, i);
                Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                Vec_IntWriteEntry( iNonSingleton, j, temp );                
            }
            else if( observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, j)], 0)] == 
                     observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, i)], 0)] )
            {
                if( Vec_IntSize(iMatch2[Vec_IntEntry(iNonSingleton, j)]) < Vec_IntSize(iMatch2[Vec_IntEntry(iNonSingleton, i)]) )
                {
                    int temp = Vec_IntEntry(iNonSingleton, i);
                    Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                    Vec_IntWriteEntry( iNonSingleton, j, temp );                
                }
            }
    }    

    /*for(i = 0; i < Vec_IntSize(iNonSingleton) - 1; i++)
    {
        for(j = i + 1; j < Vec_IntSize(iNonSingleton); j++)        
            if( Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, j)])]]) > 
                Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, i)])]]) )
            {                
                int temp = Vec_IntEntry(iNonSingleton, i);
                Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                Vec_IntWriteEntry( iNonSingleton, j, temp );                
            }
            else if( Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, j)])]]) == 
                Vec_IntSize(oDep2[oGroup2[Vec_IntEntryLast(iMatch2[Vec_IntEntry(iNonSingleton, i)])]]) )
            {
                if( observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, j)], 0)] > 
                        observability2[Vec_IntEntry(iMatch2[Vec_IntEntry(iNonSingleton, i)], 0)] )
                {
                    int temp = Vec_IntEntry(iNonSingleton, i);
                    Vec_IntWriteEntry( iNonSingleton, i, Vec_IntEntry(iNonSingleton, j) );
                    Vec_IntWriteEntry( iNonSingleton, j, temp );                
                }
            }
    }*/

    matchFound = match1by1(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                           pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup2, oMatch2, oGroup2,
                           matchedOutputs1, matchedOutputs2, oMatchedGroups, iNonSingleton, 0, 0);

    if( matchFound && Vec_IntSize(matchedOutputs1) != Abc_NtkPoNum(pNtk1) )
    {
        Vec_Int_t * oNonSingleton;
        Vec_Ptr_t * oMatchPairs;
        Abc_Ntk_t * subNtk1, * subNtk2;

        oNonSingleton = Vec_IntAlloc( 10 );
        
        oMatchPairs = Vec_PtrAlloc(Abc_NtkPoNum(pNtk1) * 2);    

        for(i = 0; i < *oLastItem1; i++)
            if( Vec_IntSize(oMatch1[i]) > 1 && Vec_IntFind( oMatchedGroups, i) == -1 )
                Vec_IntPush(oNonSingleton, i);
            
        subNtk1 = computeCofactor(pNtk1, nodesInLevel1, NULL, matchedInputs1);
        subNtk2 = computeCofactor(pNtk2, nodesInLevel2, NULL, matchedInputs2);
        
        matchFound = matchNonSingletonOutputs(pNtk1, nodesInLevel1, iMatch1, iDep1, matchedInputs1, iGroup1, oMatch1, oGroup1,
                                 pNtk2, nodesInLevel2, iMatch2, iDep2, matchedInputs2, iGroup1, oMatch2, oGroup2,
                                 matchedOutputs1, matchedOutputs2, oMatchedGroups, NULL,                         
                                 subNtk1, subNtk2, oMatchPairs, oNonSingleton, 0, 0, 0, 0);

        Vec_IntFree( oNonSingleton );        
        Vec_PtrFree( oMatchPairs );

        Abc_NtkDelete(subNtk1);
        Abc_NtkDelete(subNtk2);
    }

    satTime = (float)(Abc_Clock() - clk)/(float)(CLOCKS_PER_SEC);    

    if( matchFound )
    {
          checkEquivalence( pNtk1, matchedInputs1, matchedOutputs1, pNtk2, matchedInputs2, matchedOutputs2);

        result = fopen("IOmatch.txt", "w");

        fprintf(result, "I/O = %d / %d \n\n", Abc_NtkPiNum(pNtk1), Abc_NtkPoNum(pNtk1));
        
        for(i = 0; i < Vec_IntSize(matchedInputs1) ; i++)
              fprintf(result, "{%s}\t{%s}\n", Abc_ObjName(Abc_NtkPi(pNtk1, Vec_IntEntry(matchedInputs1, i))), Abc_ObjName(Abc_NtkPi(pNtk2, Vec_IntEntry(matchedInputs2, i))) );                                    

        fprintf(result, "\n-----------------------------------------\n");

        for(i = 0; i < Vec_IntSize(matchedOutputs1) ; i++)
            fprintf(result, "{%s}\t{%s}\n", Abc_ObjName(Abc_NtkPo(pNtk1, Vec_IntEntry(matchedOutputs1, i))), Abc_ObjName(Abc_NtkPo(pNtk2, Vec_IntEntry(matchedOutputs2, i))) );                                    

        fclose( result );    
    }

    Vec_IntFree( matchedInputs1 );
    Vec_IntFree( matchedInputs2 );
    Vec_IntFree( matchedOutputs1 );
    Vec_IntFree( matchedOutputs2 );
    Vec_IntFree( iNonSingleton );
    Vec_IntFree( oMatchedGroups );
    
    for(i = 0; i <= Abc_AigLevel( pNtk1 ); i++)    
        Vec_PtrFree( nodesInLevel1[i] );
    for(i = 0; i <= Abc_AigLevel( pNtk2 ); i++)    
        Vec_PtrFree( nodesInLevel2[i] );
    

    ABC_FREE( nodesInLevel1 );
    ABC_FREE( nodesInLevel2 );
    /*fclose(matchFile);*/
    
    return satTime;
}